

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O2

void af_glyph_hints_align_weak_points(AF_GlyphHints hints,AF_Dimension dim)

{
  AF_Point_conflict p1;
  AF_Point_conflict *ppAVar1;
  int iVar2;
  AF_Point_conflict p2;
  long lVar3;
  AF_Point_conflict pAVar4;
  AF_Point_conflict pAVar5;
  ushort uVar6;
  AF_Point_conflict *ppAVar7;
  AF_Point_conflict ref2;
  AF_Point_conflict pAVar8;
  AF_Point_conflict ref1;
  AF_Point_conflict ref2_00;
  AF_Point_conflict pAVar9;
  
  pAVar5 = hints->points;
  ppAVar7 = hints->contours;
  pAVar8 = pAVar5 + hints->num_points;
  iVar2 = hints->num_contours;
  if (dim == AF_DIMENSION_HORZ) {
    uVar6 = 4;
    for (pAVar4 = pAVar5; pAVar4 < pAVar8; pAVar4 = pAVar4 + 1) {
      pAVar4->u = pAVar4->x;
      pAVar4->v = pAVar4->ox;
    }
  }
  else {
    uVar6 = 8;
    for (pAVar4 = pAVar5; pAVar4 < pAVar8; pAVar4 = pAVar4 + 1) {
      pAVar4->u = pAVar4->y;
      pAVar4->v = pAVar4->oy;
    }
  }
  ppAVar1 = ppAVar7 + iVar2;
  do {
    if (ppAVar1 <= ppAVar7) {
      if (dim == AF_DIMENSION_HORZ) {
        for (; pAVar5 < pAVar8; pAVar5 = pAVar5 + 1) {
          pAVar5->x = pAVar5->u;
        }
      }
      else {
        for (; pAVar5 < pAVar8; pAVar5 = pAVar5 + 1) {
          pAVar5->y = pAVar5->u;
        }
      }
      return;
    }
    pAVar4 = *ppAVar7;
    p2 = pAVar4->prev;
    pAVar9 = pAVar4;
    for (ref2 = pAVar4; pAVar9 = pAVar9 + 1, ref2 <= p2; ref2 = ref2 + 1) {
      ref2_00 = ref2;
      if ((uVar6 & ref2->flags) != 0) goto LAB_00236d3b;
    }
LAB_00236e03:
    ppAVar7 = ppAVar7 + 1;
  } while( true );
LAB_00236d3b:
  ref1 = ref2_00;
  if (ref1 < p2) goto code_r0x00236d43;
  goto LAB_00236d4f;
code_r0x00236d43:
  ref2_00 = ref1 + 1;
  if ((uVar6 & ref1[1].flags) == 0) {
LAB_00236d4f:
    p1 = ref1 + 1;
    ref2_00 = p1;
    while( true ) {
      if (p2 < ref2_00) {
        if (ref2 == ref1) {
          lVar3 = ref2->u - ref2->v;
          if (lVar3 != 0) {
            for (; pAVar4 < ref2; pAVar4 = pAVar4 + 1) {
              pAVar4->u = pAVar4->v + lVar3;
            }
            for (; pAVar9 <= p2; pAVar9 = pAVar9 + 1) {
              pAVar9->u = pAVar9->v + lVar3;
            }
          }
        }
        else {
          if (ref1 < p2) {
            af_iup_interp(p1,p2,ref1,ref2);
          }
          if (pAVar5 < ref2) {
            af_iup_interp(pAVar4,ref2 + -1,ref1,ref2);
          }
        }
        goto LAB_00236e03;
      }
      if ((uVar6 & ref2_00->flags) != 0) break;
      ref2_00 = ref2_00 + 1;
    }
    af_iup_interp(p1,ref2_00 + -1,ref1,ref2_00);
  }
  goto LAB_00236d3b;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_align_weak_points( AF_GlyphHints  hints,
                                    AF_Dimension   dim )
  {
    AF_Point   points        = hints->points;
    AF_Point   point_limit   = points + hints->num_points;
    AF_Point*  contour       = hints->contours;
    AF_Point*  contour_limit = contour + hints->num_contours;
    FT_UInt    touch_flag;
    AF_Point   point;
    AF_Point   end_point;
    AF_Point   first_point;


    /* PASS 1: Move segment points to edge positions */

    if ( dim == AF_DIMENSION_HORZ )
    {
      touch_flag = AF_FLAG_TOUCH_X;

      for ( point = points; point < point_limit; point++ )
      {
        point->u = point->x;
        point->v = point->ox;
      }
    }
    else
    {
      touch_flag = AF_FLAG_TOUCH_Y;

      for ( point = points; point < point_limit; point++ )
      {
        point->u = point->y;
        point->v = point->oy;
      }
    }

    for ( ; contour < contour_limit; contour++ )
    {
      AF_Point  first_touched, last_touched;


      point       = *contour;
      end_point   = point->prev;
      first_point = point;

      /* find first touched point */
      for (;;)
      {
        if ( point > end_point )  /* no touched point in contour */
          goto NextContour;

        if ( point->flags & touch_flag )
          break;

        point++;
      }

      first_touched = point;

      for (;;)
      {
        FT_ASSERT( point <= end_point                 &&
                   ( point->flags & touch_flag ) != 0 );

        /* skip any touched neighbours */
        while ( point < end_point                    &&
                ( point[1].flags & touch_flag ) != 0 )
          point++;

        last_touched = point;

        /* find the next touched point, if any */
        point++;
        for (;;)
        {
          if ( point > end_point )
            goto EndContour;

          if ( ( point->flags & touch_flag ) != 0 )
            break;

          point++;
        }

        /* interpolate between last_touched and point */
        af_iup_interp( last_touched + 1, point - 1,
                       last_touched, point );
      }

    EndContour:
      /* special case: only one point was touched */
      if ( last_touched == first_touched )
        af_iup_shift( first_point, end_point, first_touched );

      else /* interpolate the last part */
      {
        if ( last_touched < end_point )
          af_iup_interp( last_touched + 1, end_point,
                         last_touched, first_touched );

        if ( first_touched > points )
          af_iup_interp( first_point, first_touched - 1,
                         last_touched, first_touched );
      }

    NextContour:
      ;
    }

    /* now save the interpolated values back to x/y */
    if ( dim == AF_DIMENSION_HORZ )
    {
      for ( point = points; point < point_limit; point++ )
        point->x = point->u;
    }
    else
    {
      for ( point = points; point < point_limit; point++ )
        point->y = point->u;
    }
  }